

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall
HFactor::ftranCall(HFactor *this,vector<double,_std::allocator<double>_> *vector,
                  HighsTimerClock *factor_timer_clock_pointer)

{
  HVector *in_RDX;
  HFactor *in_RSI;
  HighsTimerClock *in_RDI;
  double expected_density;
  FactorTimer factor_timer;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd8;
  vector<double,_std::allocator<double>_> *__x;
  FactorTimer *in_stack_ffffffffffffffe0;
  
  FactorTimer::start(in_stack_ffffffffffffffe0,(HighsInt)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                     in_RDI);
  HVectorBase<double>::clearScalars((HVectorBase<double> *)&in_RDI[0x36].clock_);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffd8);
  *(undefined4 *)
   ((long)&in_RDI[0x36].clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0xffffffff;
  __x = (vector<double,_std::allocator<double>_> *)0x3ff0000000000000;
  ftranCall(in_RSI,in_RDX,(double)in_stack_ffffffffffffffe0,(HighsTimerClock *)0x3ff0000000000000);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffe0,__x);
  FactorTimer::stop(in_stack_ffffffffffffffe0,(HighsInt)((ulong)__x >> 0x20),in_RDI);
  return;
}

Assistant:

void HFactor::ftranCall(std::vector<double>& vector,
                        HighsTimerClock* factor_timer_clock_pointer) {
  FactorTimer factor_timer;
  factor_timer.start(FactorFtran, factor_timer_clock_pointer);
  // Only have to clear the scalars of the local HVector, since the
  // array is moved in. Set the count to -1 to indicate that indices
  // aren't known.
  this->rhs_.clearScalars();
  this->rhs_.array = std::move(vector);
  this->rhs_.count = -1;
  const double expected_density = 1;
  ftranCall(this->rhs_, expected_density, factor_timer_clock_pointer);
  vector = std::move(this->rhs_.array);
  factor_timer.stop(FactorFtran, factor_timer_clock_pointer);
}